

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O0

size_t __thiscall
wasm::
SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
::count(SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
        *this,LocalSet **x)

{
  bool bVar1;
  const_reference ppLVar2;
  ulong local_28;
  size_t i;
  LocalSet **x_local;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *this_local;
  
  bVar1 = usingFixed(this);
  if (bVar1) {
    for (local_28 = 0; local_28 < (this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
        local_28 = local_28 + 1) {
      ppLVar2 = std::array<wasm::LocalSet_*,_2UL>::operator[]
                          (&(this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage,
                           local_28);
      if (*ppLVar2 == *x) {
        return 1;
      }
    }
    this_local = (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                  *)0x0;
  }
  else {
    this_local = (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                  *)std::
                    set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                    ::count(&this->flexible,x);
  }
  return (size_t)this_local;
}

Assistant:

size_t count(const T& x) const {
    if (usingFixed()) {
      // Do a linear search.
      for (size_t i = 0; i < fixed.used; i++) {
        if (fixed.storage[i] == x) {
          return 1;
        }
      }
      return 0;
    } else {
      return flexible.count(x);
    }
  }